

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

void mp::WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,PLConParams *plp)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  PLPoints *this;
  BasicWriter<char> *pBVar1;
  char *in_RDI;
  size_t i;
  PLPoints *p;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  BasicWriter<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff98;
  BasicWriter<char> *in_stack_ffffffffffffffa0;
  BasicWriter<char> *this_00;
  char *pcVar2;
  PLConParams *in_stack_ffffffffffffffb0;
  BasicWriter<char> *local_30;
  
  pcVar2 = in_RDI;
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_ffffffffffffff80,
             (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  value.size_ = (size_t)in_stack_ffffffffffffffb0;
  value.data_ = pcVar2;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,value);
  this = PLConParams::GetPLPoints(in_stack_ffffffffffffffb0);
  local_30 = (BasicWriter<char> *)0x0;
  while( true ) {
    this_00 = local_30;
    pBVar1 = (BasicWriter<char> *)std::vector<double,_std::allocator<double>_>::size(&this->x_);
    if (pBVar1 <= this_00) break;
    if (local_30 != (BasicWriter<char> *)0x0) {
      in_stack_ffffffffffffff98 = in_RDI;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff80,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      value_00.size_ = (size_t)in_stack_ffffffffffffffb0;
      value_00.data_ = pcVar2;
      fmt::BasicWriter<char>::operator<<(this_00,value_00);
    }
    in_stack_ffffffffffffff80 =
         fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    std::vector<double,_std::allocator<double>_>::operator[](&this->x_,(size_type)local_30);
    fmt::BasicWriter<char>::operator<<(this_00,(double)in_stack_ffffffffffffff98);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_ffffffffffffff80,
               (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    value_01.size_ = (size_t)in_stack_ffffffffffffffb0;
    value_01.data_ = pcVar2;
    fmt::BasicWriter<char>::operator<<(this_00,value_01);
    std::vector<double,_std::allocator<double>_>::operator[](&this->y_,(size_type)local_30);
    fmt::BasicWriter<char>::operator<<(this_00,(double)in_stack_ffffffffffffff98);
    fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
    local_30 = (BasicWriter<char> *)((long)&local_30->_vptr_BasicWriter + 1);
  }
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const PLConParams& plp) {
  wrt << "plpoints[";
  const auto& p = plp.GetPLPoints();
  for (size_t i=0; i<p.x_.size(); ++i) {
    if (i)
      wrt << ", ";
    wrt << '(' << p.x_[i] << ", " << p.y_[i] << ')';
  }
  wrt << ']';
}